

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O1

void read_bytes<signed_char>
               (vector<signed_char,_std::allocator<signed_char>_> *vec,size_t n_els,FILE **in)

{
  int iVar1;
  size_t sVar2;
  
  std::vector<signed_char,_std::allocator<signed_char>_>::resize(vec,n_els);
  if ((vec->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage !=
      (vec->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__shrink_to_fit_aux<std::vector<signed_char,_std::allocator<signed_char>_>,_true>::_S_do_it
              (vec);
  }
  if (n_els == 0) {
    return;
  }
  iVar1 = feof((FILE *)*in);
  if (iVar1 != 0) {
    throw_feoferr();
  }
  sVar2 = fread((vec->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                super__Vector_impl_data._M_start,1,n_els,(FILE *)*in);
  if ((sVar2 == n_els) && (iVar1 = ferror((FILE *)*in), iVar1 == 0)) {
    return;
  }
  throw_ferror(*in);
}

Assistant:

void read_bytes(std::vector<dtype> &vec, const size_t n_els, FILE *&in)
{
    vec.resize(n_els);
    vec.shrink_to_fit();
    
    if (n_els) {
        if (unlikely(feof(in))) throw_feoferr();
        size_t n_read = fread(vec.data(), sizeof(dtype), n_els, in);
        if (unlikely(n_read != n_els || ferror(in))) throw_ferror(in);
    }
}